

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing_sse2.c
# Opt level: O0

int ExtractAlpha_SSE2(uint8_t *argb,int argb_stride,int width,int height,uint8_t *alpha,
                     int alpha_stride)

{
  byte bVar1;
  char cVar2;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  byte bVar12;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  ulong *in_RDI;
  long in_R8;
  int in_R9D;
  undefined1 auVar13 [16];
  __m128i all_alphas;
  __m128i all_0xff;
  __m128i a_mask;
  int j;
  int i;
  uint32_t alpha_and;
  ulong *local_1b8;
  ulong local_1a8;
  int local_178;
  int local_174;
  long local_168;
  ulong *local_150;
  short local_138;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short sStack_130;
  short sStack_12e;
  short sStack_12c;
  short sStack_12a;
  uint32_t alpha_value;
  __m128i d0;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i *src;
  int limit;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  
  bVar12 = 0xff;
  local_1a8 = 0xffffffffffffffff;
  local_168 = in_R8;
  local_150 = in_RDI;
  for (local_178 = 0; local_178 < in_ECX; local_178 = local_178 + 1) {
    local_1b8 = local_150;
    for (local_174 = 0; local_174 < (int)(in_EDX - 1U & 0xfffffff8); local_174 = local_174 + 8) {
      auVar11._8_8_ = local_1b8[1] & 0xff000000ff;
      auVar11._0_8_ = *local_1b8 & 0xff000000ff;
      auVar13._8_8_ = local_1b8[3] & 0xff000000ff;
      auVar13._0_8_ = local_1b8[2] & 0xff000000ff;
      auVar13 = packssdw(auVar11,auVar13);
      local_138 = auVar13._0_2_;
      sStack_136 = auVar13._2_2_;
      sStack_134 = auVar13._4_2_;
      sStack_132 = auVar13._6_2_;
      sStack_130 = auVar13._8_2_;
      sStack_12e = auVar13._10_2_;
      sStack_12c = auVar13._12_2_;
      sStack_12a = auVar13._14_2_;
      cVar2 = (0 < local_138) * (local_138 < 0x100) * auVar13[0] - (0xff < local_138);
      cVar3 = (0 < sStack_136) * (sStack_136 < 0x100) * auVar13[2] - (0xff < sStack_136);
      cVar4 = (0 < sStack_134) * (sStack_134 < 0x100) * auVar13[4] - (0xff < sStack_134);
      cVar5 = (0 < sStack_132) * (sStack_132 < 0x100) * auVar13[6] - (0xff < sStack_132);
      cVar6 = (0 < sStack_130) * (sStack_130 < 0x100) * auVar13[8] - (0xff < sStack_130);
      cVar7 = (0 < sStack_12e) * (sStack_12e < 0x100) * auVar13[10] - (0xff < sStack_12e);
      cVar8 = (0 < sStack_12c) * (sStack_12c < 0x100) * auVar13[0xc] - (0xff < sStack_12c);
      cVar9 = (0 < sStack_12a) * (sStack_12a < 0x100) * auVar13[0xe] - (0xff < sStack_12a);
      *(ulong *)(local_168 + local_174) =
           CONCAT17(cVar9,CONCAT16(cVar8,CONCAT15(cVar7,CONCAT14(cVar6,CONCAT13(cVar5,CONCAT12(cVar4
                                                  ,CONCAT11(cVar3,cVar2)))))));
      local_1a8 = local_1a8 &
                  CONCAT17(cVar9,CONCAT16(cVar8,CONCAT15(cVar7,CONCAT14(cVar6,CONCAT13(cVar5,
                                                  CONCAT12(cVar4,CONCAT11(cVar3,cVar2)))))));
      local_1b8 = local_1b8 + 4;
    }
    for (; local_174 < in_EDX; local_174 = local_174 + 1) {
      bVar1 = *(byte *)((long)local_150 + (long)(local_174 << 2));
      *(byte *)(local_168 + local_174) = bVar1;
      bVar12 = bVar1 & bVar12;
    }
    local_150 = (ulong *)((long)local_150 + (long)in_ESI);
    local_168 = local_168 + in_R9D;
  }
  b0[1]._0_1_ = (char)local_1a8;
  b0[1]._1_1_ = (char)(local_1a8 >> 8);
  b0[1]._2_1_ = (char)(local_1a8 >> 0x10);
  b0[1]._3_1_ = (char)(local_1a8 >> 0x18);
  b0[1]._4_1_ = (char)(local_1a8 >> 0x20);
  b0[1]._5_1_ = (char)(local_1a8 >> 0x28);
  b0[1]._6_1_ = (char)(local_1a8 >> 0x30);
  b0[1]._7_1_ = (char)(local_1a8 >> 0x38);
  auVar10[1] = -(b0[1]._1_1_ == -1);
  auVar10[0] = -((char)b0[1] == -1);
  auVar10[2] = -(b0[1]._2_1_ == -1);
  auVar10[3] = -(b0[1]._3_1_ == -1);
  auVar10[4] = -(b0[1]._4_1_ == -1);
  auVar10[5] = -(b0[1]._5_1_ == -1);
  auVar10[6] = -(b0[1]._6_1_ == -1);
  auVar10[7] = -(b0[1]._7_1_ == -1);
  auVar10[8] = 0xff;
  auVar10[9] = 0xff;
  auVar10[10] = 0xff;
  auVar10[0xb] = 0xff;
  auVar10[0xc] = 0xff;
  auVar10[0xd] = 0xff;
  auVar10[0xe] = 0xff;
  auVar10[0xf] = 0xff;
  return (int)(((SUB161(auVar10 >> 7,0) & 1 | (SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                 (SUB161(auVar10 >> 0x17,0) & 1) << 2 | (SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                 (SUB161(auVar10 >> 0x27,0) & 1) << 4 | (SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                 (SUB161(auVar10 >> 0x37,0) & 1) << 6 | SUB161(auVar10 >> 0x3f,0) << 7) & bVar12) ==
              0xff);
}

Assistant:

static int ExtractAlpha_SSE2(const uint8_t* WEBP_RESTRICT argb, int argb_stride,
                             int width, int height,
                             uint8_t* WEBP_RESTRICT alpha, int alpha_stride) {
  // alpha_and stores an 'and' operation of all the alpha[] values. The final
  // value is not 0xff if any of the alpha[] is not equal to 0xff.
  uint32_t alpha_and = 0xff;
  int i, j;
  const __m128i a_mask = _mm_set1_epi32(0xffu);  // to preserve alpha
  const __m128i all_0xff = _mm_set_epi32(0, 0, ~0u, ~0u);
  __m128i all_alphas = all_0xff;

  // We must be able to access 3 extra bytes after the last written byte
  // 'src[4 * width - 4]', because we don't know if alpha is the first or the
  // last byte of the quadruplet.
  const int limit = (width - 1) & ~7;

  for (j = 0; j < height; ++j) {
    const __m128i* src = (const __m128i*)argb;
    for (i = 0; i < limit; i += 8) {
      // load 32 argb bytes
      const __m128i a0 = _mm_loadu_si128(src + 0);
      const __m128i a1 = _mm_loadu_si128(src + 1);
      const __m128i b0 = _mm_and_si128(a0, a_mask);
      const __m128i b1 = _mm_and_si128(a1, a_mask);
      const __m128i c0 = _mm_packs_epi32(b0, b1);
      const __m128i d0 = _mm_packus_epi16(c0, c0);
      // store
      _mm_storel_epi64((__m128i*)&alpha[i], d0);
      // accumulate eight alpha 'and' in parallel
      all_alphas = _mm_and_si128(all_alphas, d0);
      src += 2;
    }
    for (; i < width; ++i) {
      const uint32_t alpha_value = argb[4 * i];
      alpha[i] = alpha_value;
      alpha_and &= alpha_value;
    }
    argb += argb_stride;
    alpha += alpha_stride;
  }
  // Combine the eight alpha 'and' into a 8-bit mask.
  alpha_and &= _mm_movemask_epi8(_mm_cmpeq_epi8(all_alphas, all_0xff));
  return (alpha_and == 0xff);
}